

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void set_counting_callbacks(secp256k1_context *ctx0,int *ecount)

{
  secp256k1_context_set_error_callback(ctx0,counting_illegal_callback_fn,ecount);
  secp256k1_context_set_illegal_callback(ctx0,counting_illegal_callback_fn,ecount);
  return;
}

Assistant:

static void set_counting_callbacks(secp256k1_context *ctx0, int *ecount) {
    secp256k1_context_set_error_callback(ctx0, counting_illegal_callback_fn, ecount);
    secp256k1_context_set_illegal_callback(ctx0, counting_illegal_callback_fn, ecount);
}